

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

int aes256ctr_setup(ptls_cipher_context_t *ctx,int is_enc,void *key)

{
  int iVar1;
  size_t in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = aesctr_setup((ptls_cipher_context_t *)key,(int)((ulong)in_RDI >> 0x20),
                       (void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  return iVar1;
}

Assistant:

static int aes256ctr_setup(ptls_cipher_context_t *ctx, int is_enc, const void *key)
{
    return aesctr_setup(ctx, is_enc, key, PTLS_AES256_KEY_SIZE);
}